

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O3

void __thiscall
sisl::array_n<bool,_2,_std::allocator<bool>_>::~array_n
          (array_n<bool,_2,_std::allocator<bool>_> *this)

{
  if (((this->_array != (bool *)0x0) && (this->first != this->last)) &&
     (this->_dims[1] * this->_dims[0] != 0)) {
    operator_delete(this->first);
  }
  this->_array = (bool *)0x0;
  return;
}

Assistant:

~array_n() {
            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            // Check if the array has been allocated in the first place
            if (this->_array != nullptr && first != last && size != 0) {
                for (iterator i = first; i < last; ++i) {
                    Allocator::destroy(i);
                }
                Allocator::deallocate(first, last - first);
            }
            this->_array = nullptr;
        }